

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O3

bool Common2Mjd(COMMONTIME UT,MJDTIME *MJD)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  
  bVar2 = (bool)(-(UT.Sec <= 60.0) & -(0.0 <= UT.Sec) &
                (UT.Min < 0x3d && (UT.Hour < 0x19 && UT.Day < 0x20)));
  if (bVar2 == true) {
    uVar4 = UT.Month | 0xc;
    if (2 < UT.Month) {
      uVar4 = UT.Month;
    }
    auVar5._8_8_ = (double)(int)(short)UT.Min;
    auVar5._0_8_ = UT.Sec;
    auVar5 = divpd(auVar5,_DAT_00111770);
    dVar1 = (auVar5._8_8_ + (double)(int)(short)UT.Hour + auVar5._0_8_) / 24.0 + MJD->FracDay;
    MJD->FracDay = dVar1;
    iVar3 = (int)((double)(uVar4 + 1) * 30.6001) +
            (int)((double)(ushort)(UT.Year - (UT.Month < 3)) * 365.25) + (uint)UT.Day + -0xa5c6b;
    MJD->Day = iVar3;
    if (1.0 <= dVar1) {
      MJD->Day = iVar3 + (int)dVar1;
      MJD->FracDay = dVar1 - (double)(int)dVar1;
    }
  }
  return bVar2;
}

Assistant:

bool Common2Mjd(const COMMONTIME UT, MJDTIME &MJD)
{
    bool flag;
    unsigned short int y, m;

    // 输入合法性检测
    flag = isLegal(UT);
    if(!flag)
        return flag;

    if(UT.Month <= 2)
    {
        y = UT.Year - 1;
        m = UT.Month + 12;
    }
    else
    {
        y = UT.Year;
        m = UT.Month;
    }
    MJD.Day = int(365.25 * y) + int(30.6001 * (m + 1)) + UT.Day + 1720981;
    MJD.FracDay += (UT.Hour + UT.Min / 60.0 + (UT.Sec) / 3600.0) / 24.0;
    MJD.Day -= 2400000;
    // FracDay 合法性检测
    if(MJD.FracDay >= 1)
    {
        MJD.Day += int(MJD.FracDay);
        MJD.FracDay -= int(MJD.FracDay);
    }
    flag = true;

    return flag;
}